

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall NoteOffQueue::AddNoteOff(NoteOffQueue *this,DWORD delay,BYTE channel,BYTE key)

{
  AutoNoteOff *pAVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = TArray<AutoNoteOff,_AutoNoteOff>::Reserve(&this->super_TArray<AutoNoteOff,_AutoNoteOff>,1)
  ;
  uVar3 = (ulong)uVar2;
  while( true ) {
    pAVar1 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array;
    if (((int)uVar3 == 0) ||
       (uVar4 = (ulong)(((int)uVar3 + 1U >> 1) - 1), pAVar1[uVar4].Delay <= delay)) break;
    pAVar1[uVar3] = pAVar1[uVar4];
    uVar3 = uVar4;
  }
  pAVar1[uVar3].Delay = delay;
  pAVar1[uVar3].Channel = channel;
  pAVar1[uVar3].Key = key;
  return;
}

Assistant:

void NoteOffQueue::AddNoteOff(DWORD delay, BYTE channel, BYTE key)
{
	unsigned int i = Reserve(1);
	while (i > 0 && (*this)[Parent(i)].Delay > delay)
	{
		(*this)[i] = (*this)[Parent(i)];
		i = Parent(i);
	}
	(*this)[i].Delay = delay;
	(*this)[i].Channel = channel;
	(*this)[i].Key = key;
}